

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

void upb_Message_ClearBaseField(upb_Message *msg,upb_MiniTableField *f)

{
  size_t sVar1;
  char zeros [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x361,
                  "void upb_Message_ClearBaseField(struct upb_Message *, const upb_MiniTableField *)"
                 );
  }
  if (f->presence < 1) {
    if (f->presence < 0) {
      sVar1 = _upb_MiniTableField_OneofOffset_dont_copy_me__upb_internal_use_only(f);
      if (*(uint32_t *)((long)&msg->field_0 + sVar1) !=
          f->number_dont_copy_me__upb_internal_use_only) {
        return;
      }
      *(undefined4 *)((long)&msg->field_0 + sVar1) = 0;
    }
  }
  else {
    _upb_Message_ClearHasbit_dont_copy_me__upb_internal_use_only(msg,f);
  }
  local_28 = 0;
  uStack_20 = 0;
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            (f,(void *)((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only),
             &local_28);
  return;
}

Assistant:

UPB_API_INLINE void upb_Message_ClearBaseField(struct upb_Message* msg,
                                               const upb_MiniTableField* f) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  if (UPB_PRIVATE(_upb_MiniTableField_HasHasbit)(f)) {
    UPB_PRIVATE(_upb_Message_ClearHasbit)(msg, f);
  } else if (upb_MiniTableField_IsInOneof(f)) {
    uint32_t* ptr = UPB_PRIVATE(_upb_Message_OneofCasePtr)(msg, f);
    if (*ptr != upb_MiniTableField_Number(f)) return;
    *ptr = 0;
  }
  const char zeros[16] = {0};
  UPB_PRIVATE(_upb_MiniTableField_DataCopy)
  (f, UPB_PRIVATE(_upb_Message_MutableDataPtr)(msg, f), zeros);
}